

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<int,_4> __thiscall tcu::absDiff<int,4>(tcu *this,Vector<int,_4> *a,Vector<int,_4> *b)

{
  int iVar1;
  int *piVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  Vector<int,_4> VVar4;
  undefined4 local_40;
  undefined4 local_24;
  int ndx;
  Vector<int,_4> *b_local;
  Vector<int,_4> *a_local;
  Vector<int,_4> *res;
  
  Vector<int,_4>::Vector((Vector<int,_4> *)this);
  uVar3 = extraout_RDX;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    piVar2 = Vector<int,_4>::operator[](a,local_24);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_4>::operator[](b,local_24);
    if (*piVar2 < iVar1) {
      piVar2 = Vector<int,_4>::operator[](a,local_24);
      local_40 = *piVar2;
      piVar2 = Vector<int,_4>::operator[](b,local_24);
      local_40 = local_40 - *piVar2;
    }
    else {
      piVar2 = Vector<int,_4>::operator[](b,local_24);
      local_40 = *piVar2;
      piVar2 = Vector<int,_4>::operator[](a,local_24);
      local_40 = local_40 - *piVar2;
    }
    piVar2 = Vector<int,_4>::operator[]((Vector<int,_4> *)this,local_24);
    *piVar2 = local_40;
    uVar3 = extraout_RDX_00;
  }
  VVar4.m_data[2] = (int)uVar3;
  VVar4.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  VVar4.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar4.m_data;
}

Assistant:

static inline Vector<T, Size> absDiff (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	Vector<T, Size> res;

	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = (a[ndx] > b[ndx]) ? (a[ndx] - b[ndx]) : (b[ndx] - a[ndx]);

	return res;
}